

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O1

int __thiscall QFile::open(QFile *this,char *__file,int __oflag,...)

{
  QFileDevicePrivate *this_00;
  bool bVar1;
  char cVar2;
  int iVar3;
  FileError FVar4;
  long *plVar5;
  undefined4 extraout_var;
  int __oflag_00;
  FileError err;
  char *__file_00;
  int iVar6;
  long in_FS_OFFSET;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFileDevicePrivate *)
            (this->super_QFileDevice).super_QIODevice.d_ptr._M_t.
            super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
            super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
            super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl;
  bVar1 = QIODevice::isOpen((QIODevice *)this);
  if (!bVar1) {
    __file_00 = (char *)(ulong)((uint)__file | 2);
    if (((ulong)__file & 0x44) == 0) {
      __file_00 = (char *)((ulong)__file & 0xffffffff);
    }
    QFileDevice::unsetError(&this->super_QFileDevice);
    if (((ulong)__file_00 & 3) != 0) {
      plVar5 = (long *)(**(code **)((long)(this_00->super_QIODevicePrivate)._vptr_QIODevicePrivate +
                                   0x28))(this_00);
      cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5,(uint)__file_00 | 0x20,0);
      if (cVar2 != '\0') {
        QIODevice::open((QIODevice *)this,__file_00,__oflag_00);
        iVar6 = (int)CONCAT71((int7)((ulong)this_00 >> 8),1);
        if (((ulong)__file_00 & 4) != 0) {
          iVar3 = (*(this->super_QFileDevice).super_QIODevice._vptr_QIODevice[6])(this);
          (*(this->super_QFileDevice).super_QIODevice._vptr_QIODevice[7])
                    (this,CONCAT44(extraout_var,iVar3));
        }
        goto LAB_00112936;
      }
      FVar4 = QAbstractFileEngine::error
                        ((this_00->fileEngine)._M_t.
                         super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                         .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl);
      err = OpenError;
      if (FVar4 != UnspecifiedError) {
        err = FVar4;
      }
      QAbstractFileEngine::errorString
                (&local_40,
                 (this_00->fileEngine)._M_t.
                 super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                 .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl);
      QFileDevicePrivate::setError(this_00,err,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  iVar6 = 0;
LAB_00112936:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QFile::open(OpenMode mode)
{
    Q_D(QFile);
    if (isOpen())
        return file_already_open(*this);
    // Either Append or NewOnly implies WriteOnly
    if (mode & (Append | NewOnly))
        mode |= WriteOnly;
    unsetError();
    if ((mode & (ReadOnly | WriteOnly)) == 0) {
        qWarning("QIODevice::open: File access not specified");
        return false;
    }

    // QIODevice provides the buffering, so there's no need to request it from the file engine.
    if (d->engine()->open(mode | QIODevice::Unbuffered)) {
        QIODevice::open(mode);
        if (mode & Append)
            seek(size());
        return true;
    }
    QFile::FileError err = d->fileEngine->error();
    if (err == QFile::UnspecifiedError)
        err = QFile::OpenError;
    d->setError(err, d->fileEngine->errorString());
    return false;
}